

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O1

void google::anon_unknown_0::DumpStackFrameInfo(char *prefix,void *pc)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  size_t __n;
  ulong uVar8;
  char *pcVar9;
  char *start;
  char *__src;
  MinimalFormatter formatter;
  char buf [1024];
  char symbolized [1024];
  char acStack_103e [2030];
  undefined8 uStack_850;
  MinimalFormatter local_840;
  char local_828 [2048];
  
  uStack_850 = 0x11f74c;
  bVar4 = Symbolize((void *)((long)pc + -1),local_828 + 0x400,0x400);
  pcVar9 = "(unknown)";
  if (bVar4) {
    pcVar9 = local_828 + 0x400;
  }
  local_840.buffer_ = local_828;
  local_840.end_ = local_828 + 0x400;
  uVar5 = 0;
  cVar6 = *prefix;
  while (cVar6 != '\0') {
    if (uVar5 == 0x400) {
      uVar5 = 0x400;
      break;
    }
    local_828[uVar5] = cVar6;
    lVar7 = uVar5 + 1;
    uVar5 = uVar5 + 1;
    cVar6 = prefix[lVar7];
  }
  cVar6 = '@';
  lVar7 = 0;
  uVar8 = uVar5;
  do {
    if (0x3ff < uVar8) break;
    local_828[uVar8] = cVar6;
    cVar6 = "@ "[lVar7 + 1];
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 1;
  } while (lVar7 != 2);
  uVar5 = lVar7 + uVar5;
  __src = local_828 + uVar5;
  cVar6 = '0';
  lVar7 = 0;
  uVar8 = uVar5;
  do {
    if (0x3ff < uVar8) goto LAB_0011f80e;
    local_828[uVar8] = cVar6;
    cVar6 = "+0x"[lVar7 + 2];
    lVar7 = lVar7 + 1;
    uVar8 = uVar8 + 1;
  } while (lVar7 != 2);
  lVar7 = 2;
LAB_0011f80e:
  local_840.cursor_ = __src + lVar7;
  uStack_850 = 0x11f82a;
  MinimalFormatter::AppendUint64(&local_840,(uint64)pc,0x10);
  pcVar2 = local_840.cursor_;
  pcVar1 = local_828 + uVar5 + 0x12;
  pcVar3 = local_840.cursor_;
  if (local_840.cursor_ < pcVar1) {
    __n = (long)pcVar1 - (long)local_840.cursor_;
    if ((long)local_840.cursor_ - (long)__src != 0) {
      uStack_850 = 0x11f851;
      memmove(__src + __n,__src,(long)local_840.cursor_ - (long)__src);
    }
    pcVar3 = pcVar1;
    if (pcVar1 != pcVar2) {
      uStack_850 = 0x11f866;
      memset(__src,0x20,__n);
    }
  }
  local_840.cursor_ = pcVar3;
  bVar4 = local_840.cursor_ < local_840.end_;
  if (bVar4) {
    *local_840.cursor_ = ' ';
  }
  cVar6 = *pcVar9;
  for (lVar7 = 0; (cVar6 != '\0' && (local_840.cursor_ + lVar7 + (ulong)bVar4 < local_840.end_));
      lVar7 = lVar7 + 1) {
    local_840.cursor_[lVar7 + (ulong)bVar4] = cVar6;
    cVar6 = pcVar9[lVar7 + 1];
  }
  local_840.cursor_ = local_840.cursor_ + lVar7 + (ulong)bVar4;
  if (local_840.cursor_ < local_840.end_) {
    *local_840.cursor_ = '\n';
  }
  local_840.cursor_ = local_840.cursor_ + (local_840.cursor_ < local_840.end_);
  uStack_850 = 0x11f8de;
  (*(code *)(anonymous_namespace)::g_failure_writer)
            (local_828,(long)local_840.cursor_ - (long)local_840.buffer_);
  return;
}

Assistant:

void DumpStackFrameInfo(const char* prefix, void* pc) {
  // Get the symbol name.
  const char* symbol = "(unknown)";
  char symbolized[1024];  // Big enough for a sane symbol.
  // Symbolizes the previous address of pc because pc may be in the
  // next function.
  if (Symbolize(reinterpret_cast<char*>(pc) - 1, symbolized,
                sizeof(symbolized))) {
    symbol = symbolized;
  }

  char buf[1024];  // Big enough for stack frame info.
  MinimalFormatter formatter(buf, sizeof(buf));

  formatter.AppendString(prefix);
  formatter.AppendString("@ ");
  const int width = 2 * sizeof(void*) + 2;  // + 2  for "0x".
  formatter.AppendHexWithPadding(reinterpret_cast<uintptr_t>(pc), width);
  formatter.AppendString(" ");
  formatter.AppendString(symbol);
  formatter.AppendString("\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}